

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorldImporter.cpp
# Opt level: O0

btCollisionShape * __thiscall
btCollisionWorldImporter::createCylinderShapeY
          (btCollisionWorldImporter *this,btScalar radius,btScalar height)

{
  btCollisionShape *this_00;
  btCylinderShape *shape;
  btVector3 local_28;
  btCollisionShape *local_18;
  btScalar local_10;
  btScalar local_c [3];
  
  this_00 = (btCollisionShape *)btCylinderShape::operator_new(0x1878d9);
  btVector3::btVector3(&local_28,local_c,&local_10,local_c);
  btCylinderShape::btCylinderShape((btCylinderShape *)this,(btVector3 *)CONCAT44(radius,height));
  local_18 = this_00;
  btAlignedObjectArray<btCollisionShape_*>::push_back
            ((btAlignedObjectArray<btCollisionShape_*> *)this_00,(btCollisionShape **)this_00);
  return local_18;
}

Assistant:

btCollisionShape* btCollisionWorldImporter::createCylinderShapeY(btScalar radius,btScalar height)
{
	btCylinderShape* shape = new btCylinderShape(btVector3(radius,height,radius));
	m_allocatedCollisionShapes.push_back(shape);
	return shape;
}